

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O2

int ImfHeaderSetM33fAttribute(ImfHeader *hdr,char *name,float (*m) [3])

{
  Iterator IVar1;
  iterator iVar2;
  TypedAttribute<Imath_3_2::Matrix33<float>_> *pTVar3;
  TypedAttribute<Imath_3_2::Matrix33<float>_> local_70;
  M33f m3;
  
  Imath_3_2::Matrix33<float>::Matrix33(&m3,m);
  IVar1 = Imf_3_4::Header::find((Header *)hdr,name);
  iVar2._M_node = (_Base_ptr)Imf_3_4::Header::end((Header *)hdr);
  if (IVar1._i._M_node == (iterator)iVar2._M_node) {
    Imf_3_4::TypedAttribute<Imath_3_2::Matrix33<float>_>::TypedAttribute(&local_70,&m3);
    Imf_3_4::Header::insert((Header *)hdr,name,&local_70.super_Attribute);
    Imf_3_4::TypedAttribute<Imath_3_2::Matrix33<float>_>::~TypedAttribute(&local_70);
  }
  else {
    pTVar3 = Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<Imath_3_2::Matrix33<float>>>
                       ((Header *)hdr,name);
    Imath_3_2::Matrix33<float>::operator=(&pTVar3->_value,&m3);
  }
  return 1;
}

Assistant:

int
ImfHeaderSetM33fAttribute (
    ImfHeader* hdr, const char name[], const float m[3][3])
{
    try
    {
        M33f m3 (m);

        if (header (hdr)->find (name) == header (hdr)->end ())
            header (hdr)->insert (
                name, OPENEXR_IMF_INTERNAL_NAMESPACE::M33fAttribute (m3));
        else
            header (hdr)
                ->typedAttribute<
                    OPENEXR_IMF_INTERNAL_NAMESPACE::M33fAttribute> (name)
                .value () = m3;

        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}